

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::ArenaTest_SwapBetweenArenaAndNonArenaWithAllFieldsSet_Test::TestBody
          (ArenaTest_SwapBetweenArenaAndNonArenaWithAllFieldsSet_Test *this)

{
  TestAllTypes *message;
  Arena arena2;
  TestAllTypes non_arena_message;
  ThreadSafeArena local_3f0;
  TestAllTypes local_348;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&local_348);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&local_348);
  internal::ThreadSafeArena::ThreadSafeArena(&local_3f0);
  message = (TestAllTypes *)
            Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&local_3f0);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(message);
  proto2_unittest::TestAllTypes::Swap(message,&local_348);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(message);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(&local_348);
  internal::ThreadSafeArena::~ThreadSafeArena(&local_3f0);
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_348);
  return;
}

Assistant:

TEST(ArenaTest, SwapBetweenArenaAndNonArenaWithAllFieldsSet) {
  TestAllTypes non_arena_message;
  TestUtil::SetAllFields(&non_arena_message);
  {
    Arena arena2;
    TestAllTypes* arena2_message = Arena::Create<TestAllTypes>(&arena2);
    TestUtil::SetAllFields(arena2_message);
    arena2_message->Swap(&non_arena_message);
    TestUtil::ExpectAllFieldsSet(*arena2_message);
    TestUtil::ExpectAllFieldsSet(non_arena_message);
  }
}